

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

void __thiscall
t_xml_generator::t_xml_generator
          (t_xml_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  _Rb_tree_node_base *__rhs;
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  
  t_generator::t_generator(&this->super_t_generator,program);
  (this->super_t_generator)._vptr_t_generator = (_func_int **)&PTR__t_xml_generator_004120e8;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_xml_);
  p_Var1 = &(this->programs_)._M_t._M_impl.super__Rb_tree_header;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->elements_).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->elements_,0);
  this->should_merge_includes_ = false;
  this->should_use_default_ns_ = true;
  this->should_use_namespaces_ = true;
  p_Var3 = (parsed_options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(parsed_options->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_t_generator).out_dir_base_,0,
                 (char *)(this->super_t_generator).out_dir_base_._M_string_length,0x3ab523);
      return;
    }
    __rhs = p_Var3 + 1;
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      this->should_merge_includes_ = true;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        this->should_use_default_ns_ = false;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar2 != 0) {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
          std::operator+(__return_storage_ptr__,"unknown option xml:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        this->should_use_namespaces_ = false;
      }
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

t_xml_generator( t_program* program,
                   const std::map<std::string, std::string>& parsed_options,
                   const std::string& option_string)
    : t_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    should_merge_includes_ = false;
    should_use_default_ns_ = true;
    should_use_namespaces_ = true;
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("merge") == 0) {
        should_merge_includes_ = true;
      } else if( iter->first.compare("no_default_ns") == 0) {
        should_use_default_ns_ = false;
      } else if( iter->first.compare("no_namespaces") == 0) {
        should_use_namespaces_ = false;
      } else {
        throw "unknown option xml:" + iter->first;
      }
    }

    out_dir_base_ = "gen-xml";
  }